

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

optional<bool> __thiscall slang::ast::Symbol::isDeclaredBefore(Symbol *this,LookupLocation target)

{
  Symbol *symbol;
  ushort uVar1;
  Scope *pSVar2;
  uint uVar3;
  bool bVar4;
  LookupLocation LVar5;
  LookupLocation LVar6;
  
  pSVar2 = target.scope;
  uVar3 = target.index;
  LVar5 = LookupLocation::before(this);
  if (pSVar2 != (Scope *)0x0) {
    while (LVar5.scope != pSVar2) {
      symbol = pSVar2->thisSym;
      LVar6 = LookupLocation::after(symbol);
      pSVar2 = LVar6.scope;
      bVar4 = false;
      uVar1 = 0;
      if ((symbol->kind == CompilationUnit) || (uVar1 = 0, pSVar2 == (Scope *)0x0))
      goto LAB_00352945;
      uVar3 = LVar6.index;
    }
  }
  bVar4 = LVar5.index < uVar3;
  uVar1 = 0x100;
LAB_00352945:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar1 | bVar4);
}

Assistant:

std::optional<bool> Symbol::isDeclaredBefore(LookupLocation target) const {
    LookupLocation ll = LookupLocation::before(*this);
    if (!target.getScope())
        return ll < target;

    // Walk up the target's tree until we find our own scope.
    while (target.getScope() != ll.getScope()) {
        auto& sym = target.getScope()->asSymbol();
        target = LookupLocation::after(sym);
        if (sym.kind == SymbolKind::CompilationUnit || !target.getScope())
            return std::nullopt;
    }

    return ll < target;
}